

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

enable_if_t<HasSize<span<const_float>_>::value_&&_HasData<span<const_float>_>::value,_std::ostream_&>
 pbrt::detail::operator<<(ostream *os,span<const_float> *v)

{
  float *pfVar1;
  size_t sVar2;
  ostream *poVar3;
  span<const_float> *in_RSI;
  ostream *in_RDI;
  size_t i;
  float *ptr;
  ulong local_20;
  
  std::operator<<(in_RDI,"[ ");
  pfVar1 = pstd::span<const_float>::data(in_RSI);
  local_20 = 0;
  while( true ) {
    sVar2 = pstd::span<const_float>::size(in_RSI);
    if (sVar2 <= local_20) break;
    std::ostream::operator<<(in_RDI,pfVar1[local_20]);
    sVar2 = pstd::span<const_float>::size(in_RSI);
    if (local_20 < sVar2 - 1) {
      std::operator<<(in_RDI,", ");
    }
    local_20 = local_20 + 1;
  }
  poVar3 = std::operator<<(in_RDI," ]");
  return poVar3;
}

Assistant:

inline std::enable_if_t<HasSize<T>::value && HasData<T>::value, std::ostream &>
operator<<(std::ostream &os, const T &v) {
    os << "[ ";
    auto ptr = v.data();
    for (size_t i = 0; i < v.size(); ++i) {
        os << ptr[i];
        if (i < v.size() - 1)
            os << ", ";
    }
    return os << " ]";
}